

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

uint Hash::BOBHash32(uchar *str,uint len,uint num)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = prime[num % 0x4cd];
  uVar4 = 0x9e3779b9;
  uVar2 = 0x9e3779b9;
  if (0xb < len) {
    uVar4 = 0x9e3779b9;
    do {
      uVar1 = uVar3 + *(int *)(str + 8);
      uVar6 = uVar1 >> 0xd ^ ((uVar4 + *(int *)str) - (uVar2 + *(int *)(str + 4))) - uVar1;
      uVar5 = uVar6 << 8 ^ ((uVar2 + *(int *)(str + 4)) - uVar1) - uVar6;
      uVar4 = uVar5 >> 0xd ^ (uVar1 - uVar6) - uVar5;
      uVar2 = uVar4 >> 0xc ^ (uVar6 - uVar5) - uVar4;
      uVar1 = uVar2 << 0x10 ^ (uVar5 - uVar4) - uVar2;
      uVar5 = uVar1 >> 5 ^ (uVar4 - uVar2) - uVar1;
      uVar4 = uVar5 >> 3 ^ (uVar2 - uVar1) - uVar5;
      uVar2 = uVar4 << 10 ^ (uVar1 - uVar5) - uVar4;
      uVar3 = uVar2 >> 0xf ^ (uVar5 - uVar4) - uVar2;
      str = str + 0xc;
      len = len - 0xc;
    } while (0xb < len);
  }
  uVar1 = uVar3 + len;
  switch(len) {
  case 0xb:
    uVar1 = (uint)str[10] * 0x1000000 + uVar1;
  case 10:
    uVar1 = (uint)str[9] * 0x10000 + uVar1;
  case 9:
    uVar1 = (uint)str[8] * 0x100 + uVar1;
  case 8:
    uVar2 = (uint)str[7] * 0x1000000 + uVar2;
  case 7:
    uVar2 = (uint)str[6] * 0x10000 + uVar2;
  case 6:
    uVar2 = (uint)str[5] * 0x100 + uVar2;
  case 5:
    uVar2 = str[4] + uVar2;
  case 4:
    uVar4 = (uint)str[3] * 0x1000000 + uVar4;
  case 3:
    uVar4 = (uint)str[2] * 0x10000 + uVar4;
  case 2:
    uVar4 = (uint)str[1] * 0x100 + uVar4;
  case 1:
    uVar4 = *str + uVar4;
  default:
    uVar6 = uVar1 >> 0xd ^ (uVar4 - uVar2) - uVar1;
    uVar5 = uVar6 << 8 ^ (uVar2 - uVar1) - uVar6;
    uVar4 = uVar5 >> 0xd ^ (uVar1 - uVar6) - uVar5;
    uVar2 = uVar4 >> 0xc ^ (uVar6 - uVar5) - uVar4;
    uVar5 = uVar2 << 0x10 ^ (uVar5 - uVar4) - uVar2;
    uVar1 = uVar5 >> 5 ^ (uVar4 - uVar2) - uVar5;
    uVar4 = uVar1 >> 3 ^ (uVar2 - uVar5) - uVar1;
    uVar2 = uVar4 << 10 ^ (uVar5 - uVar1) - uVar4;
    return uVar2 >> 0xf ^ uVar1 - (uVar4 + uVar2);
  }
}

Assistant:

static uint BOBHash32(const uchar* str, uint len, uint num = 0) {
		// register ub4 a,b,c,len;
		uint a, b, c;
		/* Set up the internal state */
		a = b = 0x9e3779b9;         /* the golden ratio; an arbitrary value */
		c = prime[num % MAX_PRIME]; /* the previous hash value */

		/*---------------------------------------- handle most of the key */
		while (len >= 12) {
			a += (str[0] + ((uint)str[1] << 8) + ((uint)str[2] << 16) +
				((uint)str[3] << 24));
			b += (str[4] + ((uint)str[5] << 8) + ((uint)str[6] << 16) +
				((uint)str[7] << 24));
			c += (str[8] + ((uint)str[9] << 8) + ((uint)str[10] << 16) +
				((uint)str[11] << 24));
			mix(a, b, c);
			str += 12;
			len -= 12;
		}

		/*------------------------------------- handle the last 11 bytes */
		c += len;
		switch (len) /* all the case statements fall through */
		{
		case 11:
			c += ((uint)str[10] << 24);
		case 10:
			c += ((uint)str[9] << 16);
		case 9:
			c += ((uint)str[8] << 8);
			/* the first byte of c is reserved for the length */
		case 8:
			b += ((uint)str[7] << 24);
		case 7:
			b += ((uint)str[6] << 16);
		case 6:
			b += ((uint)str[5] << 8);
		case 5:
			b += str[4];
		case 4:
			a += ((uint)str[3] << 24);
		case 3:
			a += ((uint)str[2] << 16);
		case 2:
			a += ((uint)str[1] << 8);
		case 1:
			a += str[0];
			/* case 0: nothing left to add */
		}
		mix(a, b, c);
		/*-------------------------------------------- report the result */
		return c;
	}